

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
* __thiscall adios2::Engine::AllStepsBlocksInfo(Engine *this,VariableNT *variable)

{
  bool bVar1;
  DataType DVar2;
  DataType DVar3;
  DataType DVar4;
  DataType DVar5;
  DataType DVar6;
  mapped_type *__x;
  long *in_RDX;
  map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
  *in_RDI;
  value_type *br_15;
  Info *b_15;
  const_iterator __end18;
  const_iterator __begin18;
  vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>
  *__range18;
  mapped_type *bvr_15;
  pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>
  *bv_15;
  iterator __end17_1;
  iterator __begin17_1;
  map<unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>_>
  *__range17_1;
  map<unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>_>
  blocksInfoT_14;
  value_type *br_14;
  Info *b_14;
  const_iterator __end17;
  const_iterator __begin17;
  vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>
  *__range17;
  mapped_type *bvr_14;
  pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>
  *bv_14;
  iterator __end16_1;
  iterator __begin16_1;
  map<unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>_>
  *__range16_1;
  map<unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>_>
  blocksInfoT_13;
  value_type *br_13;
  Info *b_13;
  const_iterator __end16;
  const_iterator __begin16;
  vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>
  *__range16;
  mapped_type *bvr_13;
  pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>
  *bv_13;
  iterator __end15_1;
  iterator __begin15_1;
  map<unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>_>
  *__range15_1;
  map<unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>_>
  blocksInfoT_12;
  value_type *br_12;
  Info *b_12;
  const_iterator __end15;
  const_iterator __begin15;
  vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_> *__range15
  ;
  mapped_type *bvr_12;
  pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>
  *bv_12;
  iterator __end14_1;
  iterator __begin14_1;
  map<unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>_>
  *__range14_1;
  map<unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>_>
  blocksInfoT_11;
  value_type *br_11;
  Info *b_11;
  const_iterator __end14;
  const_iterator __begin14;
  vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_> *__range14;
  mapped_type *bvr_11;
  pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>
  *bv_11;
  iterator __end13_1;
  iterator __begin13_1;
  map<unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>_>
  *__range13_1;
  map<unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>_>
  blocksInfoT_10;
  value_type *br_10;
  Info *b_10;
  const_iterator __end13;
  const_iterator __begin13;
  vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>
  *__range13;
  mapped_type *bvr_10;
  pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>
  *bv_10;
  iterator __end12_1;
  iterator __begin12_1;
  map<unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>_>
  *__range12_1;
  map<unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>_>
  blocksInfoT_9;
  value_type *br_9;
  Info *b_9;
  const_iterator __end12;
  const_iterator __begin12;
  vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>
  *__range12;
  mapped_type *bvr_9;
  pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>
  *bv_9;
  iterator __end11_1;
  iterator __begin11_1;
  map<unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>_>
  *__range11_1;
  map<unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>_>
  blocksInfoT_8;
  value_type *br_8;
  Info *b_8;
  const_iterator __end11;
  const_iterator __begin11;
  vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>
  *__range11;
  mapped_type *bvr_8;
  pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>
  *bv_8;
  iterator __end10_1;
  iterator __begin10_1;
  map<unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>_>
  *__range10_1;
  map<unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>_>
  blocksInfoT_7;
  value_type *br_7;
  Info *b_7;
  const_iterator __end10;
  const_iterator __begin10;
  vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>
  *__range10;
  mapped_type *bvr_7;
  pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>
  *bv_7;
  iterator __end9_1;
  iterator __begin9_1;
  map<unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>_>
  *__range9_1;
  map<unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>_>
  blocksInfoT_6;
  value_type *br_6;
  Info *b_6;
  const_iterator __end9;
  const_iterator __begin9;
  vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_> *__range9;
  mapped_type *bvr_6;
  pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>
  *bv_6;
  iterator __end8_1;
  iterator __begin8_1;
  map<unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>_>
  *__range8_1;
  map<unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>_>
  blocksInfoT_5;
  value_type *br_5;
  Info *b_5;
  const_iterator __end8;
  const_iterator __begin8;
  vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_> *__range8;
  mapped_type *bvr_5;
  pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>
  *bv_5;
  iterator __end7_1;
  iterator __begin7_1;
  map<unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>_>
  *__range7_1;
  map<unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>_>
  blocksInfoT_4;
  value_type *br_4;
  Info *b_4;
  const_iterator __end7;
  const_iterator __begin7;
  vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_> *__range7;
  mapped_type *bvr_4;
  pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>
  *bv_4;
  iterator __end6_1;
  iterator __begin6_1;
  map<unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>_>
  *__range6_1;
  map<unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>_>
  blocksInfoT_3;
  value_type *br_3;
  Info *b_3;
  const_iterator __end6;
  const_iterator __begin6;
  vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>
  *__range6;
  mapped_type *bvr_3;
  pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>
  *bv_3;
  iterator __end5_1;
  iterator __begin5_1;
  map<unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>_>
  *__range5_1;
  map<unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>_>
  blocksInfoT_2;
  value_type *br_2;
  Info *b_2;
  const_iterator __end5;
  const_iterator __begin5;
  vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_> *__range5;
  mapped_type *bvr_2;
  pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>
  *bv_2;
  iterator __end4_1;
  iterator __begin4_1;
  map<unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>_>
  *__range4_1;
  map<unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>_>
  blocksInfoT_1;
  value_type *br_1;
  Info *b_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>
  *__range4;
  mapped_type *bvr_1;
  pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>
  *bv_1;
  iterator __end3_1;
  iterator __begin3_1;
  map<unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>_>
  *__range3_1;
  map<unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>_>
  blocksInfoT;
  value_type *br;
  BPInfo *b;
  const_iterator __end3;
  const_iterator __begin3;
  vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  *__range3;
  mapped_type *bvr;
  pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>
  *bv;
  iterator __end2;
  iterator __begin2;
  map<unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>_>
  *__range2;
  map<unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>_>
  blocksInfo;
  map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
  *ret;
  map<unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>_>
  *in_stack_fffffffffffff518;
  allocator *paVar7;
  vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
  *in_stack_fffffffffffff520;
  mapped_type *in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff560;
  undefined4 in_stack_fffffffffffff564;
  string *in_stack_fffffffffffff568;
  undefined4 in_stack_fffffffffffff570;
  string *in_stack_fffffffffffff578;
  undefined4 in_stack_fffffffffffff580;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff5b8;
  undefined4 in_stack_fffffffffffff5c0;
  undefined4 in_stack_fffffffffffff5c4;
  DataType DVar8;
  string *in_stack_fffffffffffff5d8;
  undefined4 in_stack_fffffffffffff5e0;
  undefined4 in_stack_fffffffffffff5e4;
  Engine *in_stack_fffffffffffff630;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff638;
  allocator local_991;
  string local_990 [39];
  allocator local_969;
  string local_968 [39];
  allocator local_941;
  string local_940 [39];
  allocator local_919;
  string local_918 [32];
  reference local_8f8;
  reference local_8f0;
  Info *local_8e8;
  __normal_iterator<const_adios2::Variable<std::complex<double>_>::Info_*,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>
  local_8e0;
  vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>
  *local_8d8;
  mapped_type *local_8d0;
  reference local_8c8;
  _Self local_8c0;
  _Self local_8b8;
  undefined1 *local_8b0;
  Variable<std::complex<double>_> local_8a8;
  undefined1 local_8a0 [48];
  reference local_870;
  reference local_868;
  Info *local_860;
  __normal_iterator<const_adios2::Variable<std::complex<float>_>::Info_*,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>
  local_858;
  vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>
  *local_850;
  mapped_type *local_848;
  reference local_840;
  _Self local_838;
  _Self local_830;
  undefined1 *local_828;
  Variable<std::complex<float>_> local_820;
  undefined1 local_818 [48];
  reference local_7e8;
  reference local_7e0;
  Info *local_7d8;
  __normal_iterator<const_adios2::Variable<long_double>::Info_*,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>
  local_7d0;
  vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>
  *local_7c8;
  mapped_type *local_7c0;
  reference local_7b8;
  _Self local_7b0;
  _Self local_7a8;
  undefined1 *local_7a0;
  Variable<long_double> local_798;
  undefined1 local_790 [48];
  reference local_760;
  reference local_758;
  Info *local_750;
  __normal_iterator<const_adios2::Variable<double>::Info_*,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>
  local_748;
  vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_> *local_740
  ;
  mapped_type *local_738;
  reference local_730;
  _Self local_728;
  _Self local_720;
  undefined1 *local_718;
  Variable<double> local_710;
  undefined1 local_708 [48];
  reference local_6d8;
  reference local_6d0;
  Info *local_6c8;
  __normal_iterator<const_adios2::Variable<float>::Info_*,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>
  local_6c0;
  vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_> *local_6b8;
  mapped_type *local_6b0;
  reference local_6a8;
  _Self local_6a0;
  _Self local_698;
  undefined1 *local_690;
  Variable<float> local_688;
  undefined1 local_680 [48];
  reference local_650;
  reference local_648;
  Info *local_640;
  __normal_iterator<const_adios2::Variable<unsigned_long>::Info_*,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>
  local_638;
  vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>
  *local_630;
  mapped_type *local_628;
  reference local_620;
  _Self local_618;
  _Self local_610;
  undefined1 *local_608;
  Variable<unsigned_long> local_600;
  undefined1 local_5f8 [48];
  reference local_5c8;
  reference local_5c0;
  Info *local_5b8;
  __normal_iterator<const_adios2::Variable<unsigned_int>::Info_*,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>
  local_5b0;
  vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>
  *local_5a8;
  mapped_type *local_5a0;
  reference local_598;
  _Self local_590;
  _Self local_588;
  undefined1 *local_580;
  Variable<unsigned_int> local_578;
  undefined1 local_570 [48];
  reference local_540;
  reference local_538;
  Info *local_530;
  __normal_iterator<const_adios2::Variable<unsigned_short>::Info_*,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>
  local_528;
  vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>
  *local_520;
  mapped_type *local_518;
  reference local_510;
  _Self local_508;
  _Self local_500;
  undefined1 *local_4f8;
  Variable<unsigned_short> local_4f0;
  undefined1 local_4e8 [48];
  reference local_4b8;
  reference local_4b0;
  Info *local_4a8;
  __normal_iterator<const_adios2::Variable<unsigned_char>::Info_*,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>
  local_4a0;
  vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>
  *local_498;
  mapped_type *local_490;
  reference local_488;
  _Self local_480;
  _Self local_478;
  undefined1 *local_470;
  Variable<unsigned_char> local_468;
  undefined1 local_460 [48];
  reference local_430;
  reference local_428;
  Info *local_420;
  __normal_iterator<const_adios2::Variable<long>::Info_*,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>
  local_418;
  vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_> *local_410;
  mapped_type *local_408;
  reference local_400;
  _Self local_3f8;
  _Self local_3f0;
  undefined1 *local_3e8;
  Variable<long> local_3e0;
  undefined1 local_3d8 [48];
  reference local_3a8;
  reference local_3a0;
  Info *local_398;
  __normal_iterator<const_adios2::Variable<int>::Info_*,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>
  local_390;
  vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_> *local_388;
  mapped_type *local_380;
  reference local_378;
  _Self local_370;
  _Self local_368;
  undefined1 *local_360;
  Variable<int> local_358;
  undefined1 local_350 [48];
  reference local_320;
  reference local_318;
  Info *local_310;
  __normal_iterator<const_adios2::Variable<short>::Info_*,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>
  local_308;
  vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_> *local_300;
  mapped_type *local_2f8;
  reference local_2f0;
  _Self local_2e8;
  _Self local_2e0;
  undefined1 *local_2d8;
  Variable<short> local_2d0;
  undefined1 local_2c8 [48];
  reference local_298;
  reference local_290;
  Info *local_288;
  __normal_iterator<const_adios2::Variable<signed_char>::Info_*,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>
  local_280;
  vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>
  *local_278;
  mapped_type *local_270;
  reference local_268;
  _Self local_260;
  _Self local_258;
  undefined1 *local_250;
  Variable<signed_char> local_248;
  undefined1 local_240 [48];
  reference local_210;
  reference local_208;
  Info *local_200;
  __normal_iterator<const_adios2::Variable<char>::Info_*,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>
  local_1f8;
  vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_> *local_1f0;
  mapped_type *local_1e8;
  reference local_1e0;
  _Self local_1d8;
  _Self local_1d0;
  undefined1 *local_1c8;
  Variable<char> local_1c0;
  undefined1 local_1b8 [48];
  reference local_188;
  reference local_180;
  Info *local_178;
  __normal_iterator<const_adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info_*,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>
  local_170;
  vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>
  *local_168;
  mapped_type *local_160;
  reference local_158;
  _Self local_150;
  _Self local_148;
  undefined1 *local_140;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  undefined1 local_130 [48];
  reference local_100;
  reference local_f8;
  BPInfo *local_f0;
  __normal_iterator<const_adios2::core::VariableStruct::BPInfo_*,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>
  local_e8;
  vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  *local_e0;
  mapped_type *local_d8;
  reference local_d0;
  _Self local_c8;
  _Self local_c0;
  VariableStruct *local_b8;
  VariableStruct local_b0 [55];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [39];
  undefined1 local_19;
  long *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::
  map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
  ::map((map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
         *)0x2ab17f);
  if (*(int *)(*local_18 + 0x28) == 0x10) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,"for Engine in call to Engine::AllStepsBlocksInfo",&local_41);
    helper::CheckForNullptr<adios2::core::Engine>
              ((Engine *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    paVar7 = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,"for variable in call to Engine::AllStepsBlocksInfo",paVar7);
    helper::CheckForNullptr<adios2::core::VariableBase>
              ((VariableBase *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
               in_stack_fffffffffffff5d8);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    adios2::core::Engine::AllStepsBlocksInfoStruct(local_b0);
    local_b8 = local_b0;
    local_c0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>_>
         ::begin(in_stack_fffffffffffff518);
    local_c8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>_>
         ::end(in_stack_fffffffffffff518);
    while (bVar1 = std::operator!=(&local_c0,&local_c8), bVar1) {
      local_d0 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>
                              *)0x2ab30c);
      local_d8 = std::
                 map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                 ::operator[]((map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                              (key_type *)in_stack_fffffffffffff558);
      local_e0 = &local_d0->second;
      local_e8._M_current =
           (BPInfo *)
           std::
           vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
           ::begin((vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
                    *)in_stack_fffffffffffff518);
      local_f0 = (BPInfo *)
                 std::
                 vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
                 ::end((vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
                        *)in_stack_fffffffffffff518);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_adios2::core::VariableStruct::BPInfo_*,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>
                                 *)in_stack_fffffffffffff520,
                                (__normal_iterator<const_adios2::core::VariableStruct::BPInfo_*,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>
                                 *)in_stack_fffffffffffff518), bVar1) {
        local_f8 = __gnu_cxx::
                   __normal_iterator<const_adios2::core::VariableStruct::BPInfo_*,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>
                   ::operator*(&local_e8);
        std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
        emplace_back<>(in_stack_fffffffffffff520);
        local_100 = std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                    ::back(in_stack_fffffffffffff520);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                   in_stack_fffffffffffff5b8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                   in_stack_fffffffffffff5b8);
        local_100->WriterID = local_f8->WriterID;
        local_100->Step = local_f8->Step;
        local_100->IsReverseDims = (bool)(local_f8->IsReverseDims & 1);
        local_100->IsValue = (bool)(local_f8->IsValue & 1);
        __gnu_cxx::
        __normal_iterator<const_adios2::core::VariableStruct::BPInfo_*,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>
        ::operator++(&local_e8);
      }
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>
                    *)in_stack_fffffffffffff520);
    }
    std::
    map<unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>_>
    ::~map((map<unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>_>_>_>
            *)0x2ab582);
  }
  else {
    DVar8 = *(DataType *)(*local_18 + 0x28);
    DVar2 = helper::GetDataType<std::__cxx11::string>();
    if (DVar8 == DVar2) {
      Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Variable(&local_138,
               (Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)*local_18);
      AllStepsBlocksInfo<std::__cxx11::string>(in_stack_fffffffffffff630,in_stack_fffffffffffff638);
      local_140 = local_130;
      local_148._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>_>
           ::begin((map<unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>_>
                    *)in_stack_fffffffffffff518);
      local_150._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>_>
           ::end((map<unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>_>
                  *)in_stack_fffffffffffff518);
      while (bVar1 = std::operator!=(&local_148,&local_150), bVar1) {
        local_158 = std::
                    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>
                    ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>
                                 *)0x2ab650);
        local_160 = std::
                    map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                    ::operator[]((map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                                 (key_type *)in_stack_fffffffffffff558);
        local_168 = &local_158->second;
        local_170._M_current =
             (Info *)std::
                     vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>
                     ::begin((vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>
                              *)in_stack_fffffffffffff518);
        local_178 = (Info *)std::
                            vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>
                            ::end((vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>
                                   *)in_stack_fffffffffffff518);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info_*,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>
                                   *)in_stack_fffffffffffff520,
                                  (__normal_iterator<const_adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info_*,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>
                                   *)in_stack_fffffffffffff518), bVar1) {
          local_180 = __gnu_cxx::
                      __normal_iterator<const_adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info_*,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>
                      ::operator*(&local_170);
          std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
          emplace_back<>(in_stack_fffffffffffff520);
          local_188 = std::
                      vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
                      back(in_stack_fffffffffffff520);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                     in_stack_fffffffffffff5b8);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                     in_stack_fffffffffffff5b8);
          local_188->WriterID = local_180->WriterID;
          local_188->Step = local_180->Step;
          local_188->IsReverseDims = (bool)(local_180->IsReverseDims & 1);
          local_188->IsValue = (bool)(local_180->IsValue & 1);
          __gnu_cxx::
          __normal_iterator<const_adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info_*,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>
          ::operator++(&local_170);
        }
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>
                      *)in_stack_fffffffffffff520);
      }
      std::
      map<unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>_>
      ::~map((map<unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info,_std::allocator<adios2::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Info>_>_>_>_>
              *)0x2ab817);
    }
    else {
      DVar8 = *(DataType *)(*local_18 + 0x28);
      DVar2 = helper::GetDataType<char>();
      if (DVar8 == DVar2) {
        Variable<char>::Variable(&local_1c0,(Variable<char> *)*local_18);
        AllStepsBlocksInfo<char>
                  (in_stack_fffffffffffff630,(Variable<char>)in_stack_fffffffffffff638.m_Variable);
        local_1c8 = local_1b8;
        local_1d0._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>_>
             ::begin((map<unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>_>
                      *)in_stack_fffffffffffff518);
        local_1d8._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>_>
             ::end((map<unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>_>
                    *)in_stack_fffffffffffff518);
        while (bVar1 = std::operator!=(&local_1d0,&local_1d8), bVar1) {
          local_1e0 = std::
                      _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>
                      ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>
                                   *)0x2ab8e5);
          local_1e8 = std::
                      map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                      ::operator[]((map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                    *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                                   (key_type *)in_stack_fffffffffffff558);
          local_1f0 = &local_1e0->second;
          local_1f8._M_current =
               (Info *)std::
                       vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>
                       ::begin((vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>
                                *)in_stack_fffffffffffff518);
          local_200 = (Info *)std::
                              vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>
                              ::end((vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>
                                     *)in_stack_fffffffffffff518);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<const_adios2::Variable<char>::Info_*,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>
                                     *)in_stack_fffffffffffff520,
                                    (__normal_iterator<const_adios2::Variable<char>::Info_*,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>
                                     *)in_stack_fffffffffffff518), bVar1) {
            local_208 = __gnu_cxx::
                        __normal_iterator<const_adios2::Variable<char>::Info_*,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>
                        ::operator*(&local_1f8);
            std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
            emplace_back<>(in_stack_fffffffffffff520);
            local_210 = std::
                        vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                        ::back(in_stack_fffffffffffff520);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                       in_stack_fffffffffffff5b8);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                       in_stack_fffffffffffff5b8);
            local_210->WriterID = local_208->WriterID;
            local_210->Step = local_208->Step;
            local_210->IsReverseDims = (bool)(local_208->IsReverseDims & 1);
            local_210->IsValue = (bool)(local_208->IsValue & 1);
            __gnu_cxx::
            __normal_iterator<const_adios2::Variable<char>::Info_*,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>
            ::operator++(&local_1f8);
          }
          std::
          _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>
                        *)in_stack_fffffffffffff520);
        }
        std::
        map<unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>_>
        ::~map((map<unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<char>::Info,_std::allocator<adios2::Variable<char>::Info>_>_>_>_>
                *)0x2abaa0);
      }
      else {
        DVar8 = *(DataType *)(*local_18 + 0x28);
        DVar2 = helper::GetDataType<signed_char>();
        if (DVar8 == DVar2) {
          Variable<signed_char>::Variable(&local_248,(Variable<signed_char> *)*local_18);
          AllStepsBlocksInfo<signed_char>
                    (in_stack_fffffffffffff630,
                     (Variable<signed_char>)in_stack_fffffffffffff638.m_Variable);
          local_250 = local_240;
          local_258._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>_>
               ::begin((map<unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>_>
                        *)in_stack_fffffffffffff518);
          local_260._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>_>
               ::end((map<unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>_>
                      *)in_stack_fffffffffffff518);
          while (bVar1 = std::operator!=(&local_258,&local_260), bVar1) {
            local_268 = std::
                        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>
                        ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>
                                     *)0x2abb6e);
            local_270 = std::
                        map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                        ::operator[]((map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560
                                                ),(key_type *)in_stack_fffffffffffff558);
            local_278 = &local_268->second;
            local_280._M_current =
                 (Info *)std::
                         vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>
                         ::begin((vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>
                                  *)in_stack_fffffffffffff518);
            local_288 = (Info *)std::
                                vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>
                                ::end((vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>
                                       *)in_stack_fffffffffffff518);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<const_adios2::Variable<signed_char>::Info_*,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>
                                       *)in_stack_fffffffffffff520,
                                      (__normal_iterator<const_adios2::Variable<signed_char>::Info_*,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>
                                       *)in_stack_fffffffffffff518), bVar1) {
              local_290 = __gnu_cxx::
                          __normal_iterator<const_adios2::Variable<signed_char>::Info_*,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>
                          ::operator*(&local_280);
              std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
              emplace_back<>(in_stack_fffffffffffff520);
              local_298 = std::
                          vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                          ::back(in_stack_fffffffffffff520);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                         in_stack_fffffffffffff5b8);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                         in_stack_fffffffffffff5b8);
              local_298->WriterID = local_290->WriterID;
              local_298->Step = local_290->Step;
              local_298->IsReverseDims = (bool)(local_290->IsReverseDims & 1);
              local_298->IsValue = (bool)(local_290->IsValue & 1);
              __gnu_cxx::
              __normal_iterator<const_adios2::Variable<signed_char>::Info_*,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>
              ::operator++(&local_280);
            }
            std::
            _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>
            ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>
                          *)in_stack_fffffffffffff520);
          }
          std::
          map<unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>_>
          ::~map((map<unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<signed_char>::Info,_std::allocator<adios2::Variable<signed_char>::Info>_>_>_>_>
                  *)0x2abd29);
        }
        else {
          DVar8 = *(DataType *)(*local_18 + 0x28);
          DVar2 = helper::GetDataType<short>();
          if (DVar8 == DVar2) {
            Variable<short>::Variable(&local_2d0,(Variable<short> *)*local_18);
            AllStepsBlocksInfo<short>
                      (in_stack_fffffffffffff630,
                       (Variable<short>)in_stack_fffffffffffff638.m_Variable);
            local_2d8 = local_2c8;
            local_2e0._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>_>
                 ::begin((map<unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>_>
                          *)in_stack_fffffffffffff518);
            local_2e8._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>_>
                 ::end((map<unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>_>
                        *)in_stack_fffffffffffff518);
            while (bVar1 = std::operator!=(&local_2e0,&local_2e8), bVar1) {
              local_2f0 = std::
                          _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>
                          ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>
                                       *)0x2abdf7);
              local_2f8 = std::
                          map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                          ::operator[]((map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                        *)CONCAT44(in_stack_fffffffffffff564,
                                                   in_stack_fffffffffffff560),
                                       (key_type *)in_stack_fffffffffffff558);
              local_300 = &local_2f0->second;
              local_308._M_current =
                   (Info *)std::
                           vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>
                           ::begin((vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>
                                    *)in_stack_fffffffffffff518);
              local_310 = (Info *)std::
                                  vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>
                                  ::end((vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>
                                         *)in_stack_fffffffffffff518);
              while (bVar1 = __gnu_cxx::operator!=
                                       ((__normal_iterator<const_adios2::Variable<short>::Info_*,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>
                                         *)in_stack_fffffffffffff520,
                                        (__normal_iterator<const_adios2::Variable<short>::Info_*,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>
                                         *)in_stack_fffffffffffff518), bVar1) {
                local_318 = __gnu_cxx::
                            __normal_iterator<const_adios2::Variable<short>::Info_*,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>
                            ::operator*(&local_308);
                std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
                emplace_back<>(in_stack_fffffffffffff520);
                local_320 = std::
                            vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                            ::back(in_stack_fffffffffffff520);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                           in_stack_fffffffffffff5b8);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                           in_stack_fffffffffffff5b8);
                local_320->WriterID = local_318->WriterID;
                local_320->Step = local_318->Step;
                local_320->IsReverseDims = (bool)(local_318->IsReverseDims & 1);
                local_320->IsValue = (bool)(local_318->IsValue & 1);
                __gnu_cxx::
                __normal_iterator<const_adios2::Variable<short>::Info_*,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>
                ::operator++(&local_308);
              }
              std::
              _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>
              ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>
                            *)in_stack_fffffffffffff520);
            }
            std::
            map<unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>_>
            ::~map((map<unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<short>::Info,_std::allocator<adios2::Variable<short>::Info>_>_>_>_>
                    *)0x2abfb2);
          }
          else {
            DVar8 = *(DataType *)(*local_18 + 0x28);
            DVar2 = helper::GetDataType<int>();
            if (DVar8 == DVar2) {
              Variable<int>::Variable(&local_358,(Variable<int> *)*local_18);
              AllStepsBlocksInfo<int>
                        (in_stack_fffffffffffff630,
                         (Variable<int>)in_stack_fffffffffffff638.m_Variable);
              local_360 = local_350;
              local_368._M_node =
                   (_Base_ptr)
                   std::
                   map<unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>_>
                   ::begin((map<unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>_>
                            *)in_stack_fffffffffffff518);
              local_370._M_node =
                   (_Base_ptr)
                   std::
                   map<unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>_>
                   ::end((map<unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>_>
                          *)in_stack_fffffffffffff518);
              while (bVar1 = std::operator!=(&local_368,&local_370), bVar1) {
                local_378 = std::
                            _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>
                            ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>
                                         *)0x2ac080);
                local_380 = std::
                            map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                            ::operator[]((map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                          *)CONCAT44(in_stack_fffffffffffff564,
                                                     in_stack_fffffffffffff560),
                                         (key_type *)in_stack_fffffffffffff558);
                local_388 = &local_378->second;
                local_390._M_current =
                     (Info *)std::
                             vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>
                             ::begin((vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>
                                      *)in_stack_fffffffffffff518);
                local_398 = (Info *)std::
                                    vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>
                                    ::end((vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>
                                           *)in_stack_fffffffffffff518);
                while (bVar1 = __gnu_cxx::operator!=
                                         ((__normal_iterator<const_adios2::Variable<int>::Info_*,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>
                                           *)in_stack_fffffffffffff520,
                                          (__normal_iterator<const_adios2::Variable<int>::Info_*,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>
                                           *)in_stack_fffffffffffff518), bVar1) {
                  local_3a0 = __gnu_cxx::
                              __normal_iterator<const_adios2::Variable<int>::Info_*,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>
                              ::operator*(&local_390);
                  std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
                  emplace_back<>(in_stack_fffffffffffff520);
                  local_3a8 = std::
                              vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                              ::back(in_stack_fffffffffffff520);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                             in_stack_fffffffffffff5b8);
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                             in_stack_fffffffffffff5b8);
                  local_3a8->WriterID = local_3a0->WriterID;
                  local_3a8->Step = local_3a0->Step;
                  local_3a8->IsReverseDims = (bool)(local_3a0->IsReverseDims & 1);
                  local_3a8->IsValue = (bool)(local_3a0->IsValue & 1);
                  __gnu_cxx::
                  __normal_iterator<const_adios2::Variable<int>::Info_*,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>
                  ::operator++(&local_390);
                }
                std::
                _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>
                ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>
                              *)in_stack_fffffffffffff520);
              }
              std::
              map<unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>_>
              ::~map((map<unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<int>::Info,_std::allocator<adios2::Variable<int>::Info>_>_>_>_>
                      *)0x2ac23b);
            }
            else {
              DVar8 = *(DataType *)(*local_18 + 0x28);
              DVar2 = helper::GetDataType<long>();
              if (DVar8 == DVar2) {
                Variable<long>::Variable(&local_3e0,(Variable<long> *)*local_18);
                AllStepsBlocksInfo<long>
                          (in_stack_fffffffffffff630,
                           (Variable<long>)in_stack_fffffffffffff638.m_Variable);
                local_3e8 = local_3d8;
                local_3f0._M_node =
                     (_Base_ptr)
                     std::
                     map<unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>_>
                     ::begin((map<unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>_>
                              *)in_stack_fffffffffffff518);
                local_3f8._M_node =
                     (_Base_ptr)
                     std::
                     map<unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>_>
                     ::end((map<unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>_>
                            *)in_stack_fffffffffffff518);
                while (bVar1 = std::operator!=(&local_3f0,&local_3f8), bVar1) {
                  local_400 = std::
                              _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>
                              ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>
                                           *)0x2ac309);
                  local_408 = std::
                              map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                              ::operator[]((map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                            *)CONCAT44(in_stack_fffffffffffff564,
                                                       in_stack_fffffffffffff560),
                                           (key_type *)in_stack_fffffffffffff558);
                  local_410 = &local_400->second;
                  local_418._M_current =
                       (Info *)std::
                               vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>
                               ::begin((vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>
                                        *)in_stack_fffffffffffff518);
                  local_420 = (Info *)std::
                                      vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>
                                      ::end((vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>
                                             *)in_stack_fffffffffffff518);
                  while (bVar1 = __gnu_cxx::operator!=
                                           ((__normal_iterator<const_adios2::Variable<long>::Info_*,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>
                                             *)in_stack_fffffffffffff520,
                                            (__normal_iterator<const_adios2::Variable<long>::Info_*,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>
                                             *)in_stack_fffffffffffff518), bVar1) {
                    local_428 = __gnu_cxx::
                                __normal_iterator<const_adios2::Variable<long>::Info_*,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>
                                ::operator*(&local_418);
                    std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                    ::emplace_back<>(in_stack_fffffffffffff520);
                    local_430 = std::
                                vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                                ::back(in_stack_fffffffffffff520);
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                               in_stack_fffffffffffff5b8);
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                               in_stack_fffffffffffff5b8);
                    local_430->WriterID = local_428->WriterID;
                    local_430->Step = local_428->Step;
                    local_430->IsReverseDims = (bool)(local_428->IsReverseDims & 1);
                    local_430->IsValue = (bool)(local_428->IsValue & 1);
                    __gnu_cxx::
                    __normal_iterator<const_adios2::Variable<long>::Info_*,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>
                    ::operator++(&local_418);
                  }
                  std::
                  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>
                  ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>
                                *)in_stack_fffffffffffff520);
                }
                std::
                map<unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>_>
                ::~map((map<unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long>::Info,_std::allocator<adios2::Variable<long>::Info>_>_>_>_>
                        *)0x2ac4c4);
              }
              else {
                DVar8 = *(DataType *)(*local_18 + 0x28);
                DVar2 = helper::GetDataType<unsigned_char>();
                if (DVar8 == DVar2) {
                  Variable<unsigned_char>::Variable(&local_468,(Variable<unsigned_char> *)*local_18)
                  ;
                  AllStepsBlocksInfo<unsigned_char>
                            (in_stack_fffffffffffff630,
                             (Variable<unsigned_char>)in_stack_fffffffffffff638.m_Variable);
                  local_470 = local_460;
                  local_478._M_node =
                       (_Base_ptr)
                       std::
                       map<unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>_>
                       ::begin((map<unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>_>
                                *)in_stack_fffffffffffff518);
                  local_480._M_node =
                       (_Base_ptr)
                       std::
                       map<unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>_>
                       ::end((map<unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>_>
                              *)in_stack_fffffffffffff518);
                  while (bVar1 = std::operator!=(&local_478,&local_480), bVar1) {
                    local_488 = std::
                                _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>
                                ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>
                                             *)0x2ac592);
                    __x = std::
                          map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                          ::operator[]((map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                        *)CONCAT44(in_stack_fffffffffffff564,
                                                   in_stack_fffffffffffff560),
                                       (key_type *)in_stack_fffffffffffff558);
                    local_498 = &local_488->second;
                    local_490 = __x;
                    local_4a0._M_current =
                         (Info *)std::
                                 vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>
                                 ::begin((vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>
                                          *)in_stack_fffffffffffff518);
                    local_4a8 = (Info *)std::
                                        vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>
                                        ::end((vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>
                                               *)in_stack_fffffffffffff518);
                    while (bVar1 = __gnu_cxx::operator!=
                                             ((__normal_iterator<const_adios2::Variable<unsigned_char>::Info_*,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>
                                               *)in_stack_fffffffffffff520,
                                              (__normal_iterator<const_adios2::Variable<unsigned_char>::Info_*,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>
                                               *)in_stack_fffffffffffff518), bVar1) {
                      local_4b0 = __gnu_cxx::
                                  __normal_iterator<const_adios2::Variable<unsigned_char>::Info_*,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>
                                  ::operator*(&local_4a0);
                      std::
                      vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>::
                      emplace_back<>(in_stack_fffffffffffff520);
                      local_4b8 = std::
                                  vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                                  ::back(in_stack_fffffffffffff520);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__x);
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__x);
                      local_4b8->WriterID = local_4b0->WriterID;
                      local_4b8->Step = local_4b0->Step;
                      local_4b8->IsReverseDims = (bool)(local_4b0->IsReverseDims & 1);
                      local_4b8->IsValue = (bool)(local_4b0->IsValue & 1);
                      __gnu_cxx::
                      __normal_iterator<const_adios2::Variable<unsigned_char>::Info_*,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>
                      ::operator++(&local_4a0);
                    }
                    std::
                    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>
                    ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>
                                  *)in_stack_fffffffffffff520);
                  }
                  std::
                  map<unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>_>
                  ::~map((map<unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_char>::Info,_std::allocator<adios2::Variable<unsigned_char>::Info>_>_>_>_>
                          *)0x2ac74d);
                }
                else {
                  DVar2 = *(DataType *)(*local_18 + 0x28);
                  DVar3 = helper::GetDataType<unsigned_short>();
                  if (DVar2 == DVar3) {
                    Variable<unsigned_short>::Variable
                              (&local_4f0,(Variable<unsigned_short> *)*local_18);
                    AllStepsBlocksInfo<unsigned_short>
                              (in_stack_fffffffffffff630,
                               (Variable<unsigned_short>)in_stack_fffffffffffff638.m_Variable);
                    local_4f8 = local_4e8;
                    local_500._M_node =
                         (_Base_ptr)
                         std::
                         map<unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>_>
                         ::begin((map<unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>_>
                                  *)in_stack_fffffffffffff518);
                    local_508._M_node =
                         (_Base_ptr)
                         std::
                         map<unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>_>
                         ::end((map<unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>_>
                                *)in_stack_fffffffffffff518);
                    while (bVar1 = std::operator!=(&local_500,&local_508), bVar1) {
                      local_510 = std::
                                  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>
                                  ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>
                                               *)0x2ac81b);
                      local_518 = std::
                                  map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                  ::operator[]((map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                                *)CONCAT44(in_stack_fffffffffffff564,
                                                           in_stack_fffffffffffff560),
                                               (key_type *)in_stack_fffffffffffff558);
                      local_520 = &local_510->second;
                      local_528._M_current =
                           (Info *)std::
                                   vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>
                                   ::begin((vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>
                                            *)in_stack_fffffffffffff518);
                      local_530 = (Info *)std::
                                          vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>
                                          ::end((vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>
                                                 *)in_stack_fffffffffffff518);
                      while (bVar1 = __gnu_cxx::operator!=
                                               ((__normal_iterator<const_adios2::Variable<unsigned_short>::Info_*,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>
                                                 *)in_stack_fffffffffffff520,
                                                (__normal_iterator<const_adios2::Variable<unsigned_short>::Info_*,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>
                                                 *)in_stack_fffffffffffff518), bVar1) {
                        local_538 = __gnu_cxx::
                                    __normal_iterator<const_adios2::Variable<unsigned_short>::Info_*,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>
                                    ::operator*(&local_528);
                        std::
                        vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                        ::emplace_back<>(in_stack_fffffffffffff520);
                        local_540 = std::
                                    vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                                    ::back(in_stack_fffffffffffff520);
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                   in_stack_fffffffffffff5b8);
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                   in_stack_fffffffffffff5b8);
                        local_540->WriterID = local_538->WriterID;
                        local_540->Step = local_538->Step;
                        local_540->IsReverseDims = (bool)(local_538->IsReverseDims & 1);
                        local_540->IsValue = (bool)(local_538->IsValue & 1);
                        __gnu_cxx::
                        __normal_iterator<const_adios2::Variable<unsigned_short>::Info_*,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>
                        ::operator++(&local_528);
                      }
                      std::
                      _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>
                      ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>
                                    *)in_stack_fffffffffffff520);
                    }
                    std::
                    map<unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>_>
                    ::~map((map<unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_short>::Info,_std::allocator<adios2::Variable<unsigned_short>::Info>_>_>_>_>
                            *)0x2ac9d6);
                  }
                  else {
                    DVar2 = *(DataType *)(*local_18 + 0x28);
                    DVar3 = helper::GetDataType<unsigned_int>();
                    if (DVar2 == DVar3) {
                      Variable<unsigned_int>::Variable
                                (&local_578,(Variable<unsigned_int> *)*local_18);
                      AllStepsBlocksInfo<unsigned_int>
                                (in_stack_fffffffffffff630,
                                 (Variable<unsigned_int>)in_stack_fffffffffffff638.m_Variable);
                      local_580 = local_570;
                      local_588._M_node =
                           (_Base_ptr)
                           std::
                           map<unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>_>
                           ::begin((map<unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>_>
                                    *)in_stack_fffffffffffff518);
                      local_590._M_node =
                           (_Base_ptr)
                           std::
                           map<unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>_>
                           ::end((map<unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>_>
                                  *)in_stack_fffffffffffff518);
                      while (bVar1 = std::operator!=(&local_588,&local_590), bVar1) {
                        local_598 = std::
                                    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>
                                    ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>
                                                 *)0x2acaa4);
                        local_5a0 = std::
                                    map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                    ::operator[]((map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                                  *)CONCAT44(in_stack_fffffffffffff564,
                                                             in_stack_fffffffffffff560),
                                                 (key_type *)in_stack_fffffffffffff558);
                        local_5a8 = &local_598->second;
                        local_5b0._M_current =
                             (Info *)std::
                                     vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>
                                     ::begin((vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>
                                              *)in_stack_fffffffffffff518);
                        local_5b8 = (Info *)std::
                                            vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>
                                            ::end((
                                                  vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>
                                                  *)in_stack_fffffffffffff518);
                        while (bVar1 = __gnu_cxx::operator!=
                                                 ((
                                                  __normal_iterator<const_adios2::Variable<unsigned_int>::Info_*,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>
                                                  *)in_stack_fffffffffffff520,
                                                  (
                                                  __normal_iterator<const_adios2::Variable<unsigned_int>::Info_*,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>
                                                  *)in_stack_fffffffffffff518), bVar1) {
                          local_5c0 = __gnu_cxx::
                                      __normal_iterator<const_adios2::Variable<unsigned_int>::Info_*,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>
                                      ::operator*(&local_5b0);
                          std::
                          vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                          ::emplace_back<>(in_stack_fffffffffffff520);
                          local_5c8 = std::
                                      vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                                      ::back(in_stack_fffffffffffff520);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                     in_stack_fffffffffffff5b8);
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                     in_stack_fffffffffffff5b8);
                          local_5c8->WriterID = local_5c0->WriterID;
                          local_5c8->Step = local_5c0->Step;
                          local_5c8->IsReverseDims = (bool)(local_5c0->IsReverseDims & 1);
                          local_5c8->IsValue = (bool)(local_5c0->IsValue & 1);
                          __gnu_cxx::
                          __normal_iterator<const_adios2::Variable<unsigned_int>::Info_*,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>
                          ::operator++(&local_5b0);
                        }
                        std::
                        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>
                        ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>
                                      *)in_stack_fffffffffffff520);
                      }
                      std::
                      map<unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>_>
                      ::~map((map<unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_int>::Info,_std::allocator<adios2::Variable<unsigned_int>::Info>_>_>_>_>
                              *)0x2acc5f);
                    }
                    else {
                      DVar2 = *(DataType *)(*local_18 + 0x28);
                      DVar3 = helper::GetDataType<unsigned_long>();
                      if (DVar2 == DVar3) {
                        Variable<unsigned_long>::Variable
                                  (&local_600,(Variable<unsigned_long> *)*local_18);
                        AllStepsBlocksInfo<unsigned_long>
                                  (in_stack_fffffffffffff630,
                                   (Variable<unsigned_long>)in_stack_fffffffffffff638.m_Variable);
                        local_608 = local_5f8;
                        local_610._M_node =
                             (_Base_ptr)
                             std::
                             map<unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>_>
                             ::begin((map<unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>_>
                                      *)in_stack_fffffffffffff518);
                        local_618._M_node =
                             (_Base_ptr)
                             std::
                             map<unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>_>
                             ::end((map<unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>_>
                                    *)in_stack_fffffffffffff518);
                        while (bVar1 = std::operator!=(&local_610,&local_618), bVar1) {
                          local_620 = std::
                                      _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>
                                      ::operator*((
                                                  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>
                                                  *)0x2acd27);
                          local_628 = std::
                                      map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                      ::operator[]((
                                                  map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                                  *)CONCAT44(in_stack_fffffffffffff564,
                                                             in_stack_fffffffffffff560),
                                                  (key_type *)in_stack_fffffffffffff558);
                          local_630 = &local_620->second;
                          local_638._M_current =
                               (Info *)std::
                                       vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>
                                       ::begin((vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>
                                                *)in_stack_fffffffffffff518);
                          local_640 = (Info *)std::
                                              vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>
                                              ::end((
                                                  vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>
                                                  *)in_stack_fffffffffffff518);
                          while (bVar1 = __gnu_cxx::operator!=
                                                   ((
                                                  __normal_iterator<const_adios2::Variable<unsigned_long>::Info_*,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>
                                                  *)in_stack_fffffffffffff520,
                                                  (
                                                  __normal_iterator<const_adios2::Variable<unsigned_long>::Info_*,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>
                                                  *)in_stack_fffffffffffff518), bVar1) {
                            local_648 = __gnu_cxx::
                                        __normal_iterator<const_adios2::Variable<unsigned_long>::Info_*,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>
                                        ::operator*(&local_638);
                            std::
                            vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                            ::emplace_back<>(in_stack_fffffffffffff520);
                            local_650 = std::
                                        vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                                        ::back(in_stack_fffffffffffff520);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                       in_stack_fffffffffffff5b8);
                            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                       in_stack_fffffffffffff5b8);
                            local_650->WriterID = local_648->WriterID;
                            local_650->Step = local_648->Step;
                            local_650->IsReverseDims = (bool)(local_648->IsReverseDims & 1);
                            local_650->IsValue = (bool)(local_648->IsValue & 1);
                            __gnu_cxx::
                            __normal_iterator<const_adios2::Variable<unsigned_long>::Info_*,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>
                            ::operator++(&local_638);
                          }
                          std::
                          _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>
                          ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>
                                        *)in_stack_fffffffffffff520);
                        }
                        std::
                        map<unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>_>
                        ::~map((map<unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<unsigned_long>::Info,_std::allocator<adios2::Variable<unsigned_long>::Info>_>_>_>_>
                                *)0x2acedc);
                      }
                      else {
                        DVar2 = *(DataType *)(*local_18 + 0x28);
                        DVar3 = helper::GetDataType<float>();
                        if (DVar2 == DVar3) {
                          Variable<float>::Variable(&local_688,(Variable<float> *)*local_18);
                          AllStepsBlocksInfo<float>
                                    (in_stack_fffffffffffff630,
                                     (Variable<float>)in_stack_fffffffffffff638.m_Variable);
                          local_690 = local_680;
                          local_698._M_node =
                               (_Base_ptr)
                               std::
                               map<unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>_>
                               ::begin((map<unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>_>
                                        *)in_stack_fffffffffffff518);
                          local_6a0._M_node =
                               (_Base_ptr)
                               std::
                               map<unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>_>
                               ::end((map<unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>_>
                                      *)in_stack_fffffffffffff518);
                          while (bVar1 = std::operator!=(&local_698,&local_6a0), bVar1) {
                            local_6a8 = std::
                                        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>
                                        ::operator*((
                                                  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>
                                                  *)0x2acfa4);
                            local_6b0 = std::
                                        map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                        ::operator[]((
                                                  map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                                  *)CONCAT44(in_stack_fffffffffffff564,
                                                             in_stack_fffffffffffff560),
                                                  (key_type *)in_stack_fffffffffffff558);
                            local_6b8 = &local_6a8->second;
                            local_6c0._M_current =
                                 (Info *)std::
                                         vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>
                                         ::begin((vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>
                                                  *)in_stack_fffffffffffff518);
                            local_6c8 = (Info *)std::
                                                vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>
                                                ::end((
                                                  vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>
                                                  *)in_stack_fffffffffffff518);
                            while (bVar1 = __gnu_cxx::operator!=
                                                     ((
                                                  __normal_iterator<const_adios2::Variable<float>::Info_*,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>
                                                  *)in_stack_fffffffffffff520,
                                                  (
                                                  __normal_iterator<const_adios2::Variable<float>::Info_*,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>
                                                  *)in_stack_fffffffffffff518), bVar1) {
                              local_6d0 = __gnu_cxx::
                                          __normal_iterator<const_adios2::Variable<float>::Info_*,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>
                                          ::operator*(&local_6c0);
                              std::
                              vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                              ::emplace_back<>(in_stack_fffffffffffff520);
                              local_6d8 = std::
                                          vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                                          ::back(in_stack_fffffffffffff520);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                         in_stack_fffffffffffff5b8);
                              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                         in_stack_fffffffffffff5b8);
                              local_6d8->WriterID = local_6d0->WriterID;
                              local_6d8->Step = local_6d0->Step;
                              local_6d8->IsReverseDims = (bool)(local_6d0->IsReverseDims & 1);
                              local_6d8->IsValue = (bool)(local_6d0->IsValue & 1);
                              __gnu_cxx::
                              __normal_iterator<const_adios2::Variable<float>::Info_*,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>
                              ::operator++(&local_6c0);
                            }
                            std::
                            _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>
                            ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>
                                          *)in_stack_fffffffffffff520);
                          }
                          std::
                          map<unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>_>
                          ::~map((map<unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<float>::Info,_std::allocator<adios2::Variable<float>::Info>_>_>_>_>
                                  *)0x2ad159);
                        }
                        else {
                          DVar3 = *(DataType *)(*local_18 + 0x28);
                          DVar4 = helper::GetDataType<double>();
                          if (DVar3 == DVar4) {
                            Variable<double>::Variable(&local_710,(Variable<double> *)*local_18);
                            AllStepsBlocksInfo<double>
                                      (in_stack_fffffffffffff630,
                                       (Variable<double>)in_stack_fffffffffffff638.m_Variable);
                            local_718 = local_708;
                            local_720._M_node =
                                 (_Base_ptr)
                                 std::
                                 map<unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>_>
                                 ::begin((map<unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>_>
                                          *)in_stack_fffffffffffff518);
                            local_728._M_node =
                                 (_Base_ptr)
                                 std::
                                 map<unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>_>
                                 ::end((map<unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>_>
                                        *)in_stack_fffffffffffff518);
                            while (bVar1 = std::operator!=(&local_720,&local_728), bVar1) {
                              local_730 = std::
                                          _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>
                                          ::operator*((
                                                  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>
                                                  *)0x2ad221);
                              local_738 = std::
                                          map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                          ::operator[]((
                                                  map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                                  *)CONCAT44(in_stack_fffffffffffff564,
                                                             in_stack_fffffffffffff560),
                                                  (key_type *)in_stack_fffffffffffff558);
                              local_740 = &local_730->second;
                              local_748._M_current =
                                   (Info *)std::
                                           vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>
                                           ::begin((
                                                  vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>
                                                  *)in_stack_fffffffffffff518);
                              local_750 = (Info *)std::
                                                  vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>
                                                  ::end((
                                                  vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>
                                                  *)in_stack_fffffffffffff518);
                              while (bVar1 = __gnu_cxx::operator!=
                                                       ((
                                                  __normal_iterator<const_adios2::Variable<double>::Info_*,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>
                                                  *)in_stack_fffffffffffff520,
                                                  (
                                                  __normal_iterator<const_adios2::Variable<double>::Info_*,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>
                                                  *)in_stack_fffffffffffff518), bVar1) {
                                local_758 = __gnu_cxx::
                                            __normal_iterator<const_adios2::Variable<double>::Info_*,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>
                                            ::operator*(&local_748);
                                std::
                                vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                                ::emplace_back<>(in_stack_fffffffffffff520);
                                local_760 = std::
                                            vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                                            ::back(in_stack_fffffffffffff520);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                operator=((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                          in_stack_fffffffffffff5b8);
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                operator=((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                          in_stack_fffffffffffff5b8);
                                local_760->WriterID = local_758->WriterID;
                                local_760->Step = local_758->Step;
                                local_760->IsReverseDims = (bool)(local_758->IsReverseDims & 1);
                                local_760->IsValue = (bool)(local_758->IsValue & 1);
                                __gnu_cxx::
                                __normal_iterator<const_adios2::Variable<double>::Info_*,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>
                                ::operator++(&local_748);
                              }
                              std::
                              _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>
                              ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>
                                            *)in_stack_fffffffffffff520);
                            }
                            std::
                            map<unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>_>
                            ::~map((map<unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<double>::Info,_std::allocator<adios2::Variable<double>::Info>_>_>_>_>
                                    *)0x2ad3d6);
                          }
                          else {
                            DVar4 = *(DataType *)(*local_18 + 0x28);
                            DVar5 = helper::GetDataType<long_double>();
                            if (DVar4 == DVar5) {
                              Variable<long_double>::Variable
                                        (&local_798,(Variable<long_double> *)*local_18);
                              AllStepsBlocksInfo<long_double>
                                        (in_stack_fffffffffffff630,
                                         (Variable<long_double>)in_stack_fffffffffffff638.m_Variable
                                        );
                              local_7a0 = local_790;
                              local_7a8._M_node =
                                   (_Base_ptr)
                                   std::
                                   map<unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>_>
                                   ::begin((map<unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>_>
                                            *)in_stack_fffffffffffff518);
                              local_7b0._M_node =
                                   (_Base_ptr)
                                   std::
                                   map<unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>_>
                                   ::end((map<unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>_>
                                          *)in_stack_fffffffffffff518);
                              while (bVar1 = std::operator!=(&local_7a8,&local_7b0), bVar1) {
                                local_7b8 = std::
                                            _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>
                                            ::operator*((
                                                  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>
                                                  *)0x2ad49e);
                                in_stack_fffffffffffff558 =
                                     std::
                                     map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                     ::operator[]((
                                                  map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                                  *)CONCAT44(DVar4,in_stack_fffffffffffff560),
                                                  (key_type *)in_stack_fffffffffffff558);
                                local_7c8 = &local_7b8->second;
                                local_7c0 = in_stack_fffffffffffff558;
                                local_7d0._M_current =
                                     (Info *)std::
                                             vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>
                                             ::begin((
                                                  vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>
                                                  *)in_stack_fffffffffffff518);
                                local_7d8 = (Info *)std::
                                                  vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>
                                                  ::end((
                                                  vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>
                                                  *)in_stack_fffffffffffff518);
                                while (bVar1 = __gnu_cxx::operator!=
                                                         ((
                                                  __normal_iterator<const_adios2::Variable<long_double>::Info_*,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>
                                                  *)in_stack_fffffffffffff520,
                                                  (
                                                  __normal_iterator<const_adios2::Variable<long_double>::Info_*,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>
                                                  *)in_stack_fffffffffffff518), bVar1) {
                                  local_7e0 = __gnu_cxx::
                                              __normal_iterator<const_adios2::Variable<long_double>::Info_*,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>
                                              ::operator*(&local_7d0);
                                  std::
                                  vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                                  ::emplace_back<>(in_stack_fffffffffffff520);
                                  local_7e8 = std::
                                              vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                                              ::back(in_stack_fffffffffffff520);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  operator=((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                            in_stack_fffffffffffff5b8);
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                  operator=((vector<unsigned_long,_std::allocator<unsigned_long>_> *
                                            )CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                            in_stack_fffffffffffff5b8);
                                  local_7e8->WriterID = local_7e0->WriterID;
                                  local_7e8->Step = local_7e0->Step;
                                  local_7e8->IsReverseDims = (bool)(local_7e0->IsReverseDims & 1);
                                  local_7e8->IsValue = (bool)(local_7e0->IsValue & 1);
                                  __gnu_cxx::
                                  __normal_iterator<const_adios2::Variable<long_double>::Info_*,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>
                                  ::operator++(&local_7d0);
                                }
                                std::
                                _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>
                                ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>
                                              *)in_stack_fffffffffffff520);
                              }
                              std::
                              map<unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>_>
                              ::~map((map<unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<long_double>::Info,_std::allocator<adios2::Variable<long_double>::Info>_>_>_>_>
                                      *)0x2ad653);
                            }
                            else {
                              DVar5 = *(DataType *)(*local_18 + 0x28);
                              DVar6 = helper::GetDataType<std::complex<float>>();
                              if (DVar5 == DVar6) {
                                Variable<std::complex<float>_>::Variable
                                          (&local_820,(Variable<std::complex<float>_> *)*local_18);
                                AllStepsBlocksInfo<std::complex<float>>
                                          (in_stack_fffffffffffff630,
                                           (Variable<std::complex<float>_>)
                                           in_stack_fffffffffffff638.m_Variable);
                                local_828 = local_818;
                                local_830._M_node =
                                     (_Base_ptr)
                                     std::
                                     map<unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>_>
                                     ::begin((map<unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>_>
                                              *)in_stack_fffffffffffff518);
                                local_838._M_node =
                                     (_Base_ptr)
                                     std::
                                     map<unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>_>
                                     ::end((map<unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>_>
                                            *)in_stack_fffffffffffff518);
                                while (bVar1 = std::operator!=(&local_830,&local_838), bVar1) {
                                  local_840 = std::
                                              _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>
                                              ::operator*((
                                                  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>
                                                  *)0x2ad71b);
                                  local_848 = std::
                                              map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                              ::operator[]((
                                                  map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                                  *)CONCAT44(DVar4,in_stack_fffffffffffff560),
                                                  (key_type *)in_stack_fffffffffffff558);
                                  local_850 = &local_840->second;
                                  local_858._M_current =
                                       (Info *)std::
                                               vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>
                                               ::begin((
                                                  vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>
                                                  *)in_stack_fffffffffffff518);
                                  local_860 = (Info *)std::
                                                  vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>
                                                  ::end((
                                                  vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>
                                                  *)in_stack_fffffffffffff518);
                                  while (bVar1 = __gnu_cxx::operator!=
                                                           ((
                                                  __normal_iterator<const_adios2::Variable<std::complex<float>_>::Info_*,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>
                                                  *)in_stack_fffffffffffff520,
                                                  (
                                                  __normal_iterator<const_adios2::Variable<std::complex<float>_>::Info_*,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>
                                                  *)in_stack_fffffffffffff518), bVar1) {
                                    local_868 = __gnu_cxx::
                                                __normal_iterator<const_adios2::Variable<std::complex<float>_>::Info_*,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>
                                                ::operator*(&local_858);
                                    std::
                                    vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                                    ::emplace_back<>(in_stack_fffffffffffff520);
                                    local_870 = std::
                                                vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                                                ::back(in_stack_fffffffffffff520);
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    operator=((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                              in_stack_fffffffffffff5b8);
                                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                    operator=((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                               *)CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                              in_stack_fffffffffffff5b8);
                                    local_870->WriterID = local_868->WriterID;
                                    local_870->Step = local_868->Step;
                                    local_870->IsReverseDims = (bool)(local_868->IsReverseDims & 1);
                                    local_870->IsValue = (bool)(local_868->IsValue & 1);
                                    __gnu_cxx::
                                    __normal_iterator<const_adios2::Variable<std::complex<float>_>::Info_*,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>
                                    ::operator++(&local_858);
                                  }
                                  std::
                                  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>
                                  ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>
                                                *)in_stack_fffffffffffff520);
                                }
                                std::
                                map<unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>_>
                                ::~map((map<unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<float>_>::Info,_std::allocator<adios2::Variable<std::complex<float>_>::Info>_>_>_>_>
                                        *)0x2ad8d0);
                              }
                              else {
                                DVar5 = *(DataType *)(*local_18 + 0x28);
                                DVar6 = helper::GetDataType<std::complex<double>>();
                                if (DVar5 == DVar6) {
                                  Variable<std::complex<double>_>::Variable
                                            (&local_8a8,(Variable<std::complex<double>_> *)*local_18
                                            );
                                  AllStepsBlocksInfo<std::complex<double>>
                                            (in_stack_fffffffffffff630,
                                             (Variable<std::complex<double>_>)
                                             in_stack_fffffffffffff638.m_Variable);
                                  local_8b0 = local_8a0;
                                  local_8b8._M_node =
                                       (_Base_ptr)
                                       std::
                                       map<unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>_>
                                       ::begin((map<unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>_>
                                                *)in_stack_fffffffffffff518);
                                  local_8c0._M_node =
                                       (_Base_ptr)
                                       std::
                                       map<unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>_>
                                       ::end((map<unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>_>
                                              *)in_stack_fffffffffffff518);
                                  while (bVar1 = std::operator!=(&local_8b8,&local_8c0), bVar1) {
                                    local_8c8 = std::
                                                _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>
                                                ::operator*((
                                                  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>
                                                  *)0x2ad998);
                                    local_8d0 = std::
                                                map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                                ::operator[]((
                                                  map<unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>_>_>_>
                                                  *)CONCAT44(DVar4,in_stack_fffffffffffff560),
                                                  (key_type *)in_stack_fffffffffffff558);
                                    local_8d8 = &local_8c8->second;
                                    local_8e0._M_current =
                                         (Info *)std::
                                                 vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>
                                                 ::begin((
                                                  vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>
                                                  *)in_stack_fffffffffffff518);
                                    local_8e8 = (Info *)std::
                                                  vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>
                                                  ::end((
                                                  vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>
                                                  *)in_stack_fffffffffffff518);
                                    while (bVar1 = __gnu_cxx::operator!=
                                                             ((
                                                  __normal_iterator<const_adios2::Variable<std::complex<double>_>::Info_*,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>
                                                  *)in_stack_fffffffffffff520,
                                                  (
                                                  __normal_iterator<const_adios2::Variable<std::complex<double>_>::Info_*,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>
                                                  *)in_stack_fffffffffffff518), bVar1) {
                                      local_8f0 = __gnu_cxx::
                                                  __normal_iterator<const_adios2::Variable<std::complex<double>_>::Info_*,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>
                                                  ::operator*(&local_8e0);
                                      std::
                                      vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                                      ::emplace_back<>(in_stack_fffffffffffff520);
                                      local_8f8 = std::
                                                  vector<adios2::VariableNT::Info,_std::allocator<adios2::VariableNT::Info>_>
                                                  ::back(in_stack_fffffffffffff520);
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      operator=((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 *)CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                                in_stack_fffffffffffff5b8);
                                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      operator=((vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                 *)CONCAT44(DVar8,in_stack_fffffffffffff5c0),
                                                in_stack_fffffffffffff5b8);
                                      local_8f8->WriterID = local_8f0->WriterID;
                                      local_8f8->Step = local_8f0->Step;
                                      local_8f8->IsReverseDims =
                                           (bool)(local_8f0->IsReverseDims & 1);
                                      local_8f8->IsValue = (bool)(local_8f0->IsValue & 1);
                                      __gnu_cxx::
                                      __normal_iterator<const_adios2::Variable<std::complex<double>_>::Info_*,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>
                                      ::operator++(&local_8e0);
                                    }
                                    std::
                                    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>
                                    ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>
                                                  *)in_stack_fffffffffffff520);
                                  }
                                  std::
                                  map<unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>_>
                                  ::~map((map<unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::Variable<std::complex<double>_>::Info,_std::allocator<adios2::Variable<std::complex<double>_>::Info>_>_>_>_>
                                          *)0x2adb4d);
                                }
                                else {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            (local_918,"bindings::CXX11",&local_919);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_940,"Engine",&local_941);
                                  paVar7 = &local_969;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            (local_968,"AllStepsBlocksInfo",paVar7);
                                  paVar7 = &local_991;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_990,"invalid data type",paVar7)
                                  ;
                                  helper::Throw<std::runtime_error>
                                            ((string *)CONCAT44(DVar2,in_stack_fffffffffffff580),
                                             in_stack_fffffffffffff578,
                                             (string *)CONCAT44(DVar3,in_stack_fffffffffffff570),
                                             in_stack_fffffffffffff568,DVar4);
                                  std::__cxx11::string::~string(local_990);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_991);
                                  std::__cxx11::string::~string(local_968);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_969);
                                  std::__cxx11::string::~string(local_940);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_941);
                                  std::__cxx11::string::~string(local_918);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_919);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

std::map<size_t, std::vector<VariableNT::Info>>
Engine::AllStepsBlocksInfo(const VariableNT &variable) const
{
    std::map<size_t, std::vector<VariableNT::Info>> ret;
    if (variable.m_Variable->m_Type == DataType::Struct)
    {
        adios2::helper::CheckForNullptr(m_Engine,
                                        "for Engine in call to Engine::AllStepsBlocksInfo");
        adios2::helper::CheckForNullptr(variable.m_Variable,
                                        "for variable in call to Engine::AllStepsBlocksInfo");
        auto blocksInfo = m_Engine->AllStepsBlocksInfoStruct(
            *reinterpret_cast<core::VariableStruct *>(variable.m_Variable));
        for (const auto &bv : blocksInfo)
        {
            auto &bvr = ret[bv.first];
            for (const auto &b : bv.second)
            {
                bvr.emplace_back();
                auto &br = bvr.back();
                br.Start = b.Start;
                br.Count = b.Count;
                br.WriterID = b.WriterID;
                br.Step = b.Step;
                br.IsReverseDims = b.IsReverseDims;
                br.IsValue = b.IsValue;
            }
        }
    }
#define declare_type(T)                                                                            \
    else if (variable.m_Variable->m_Type == helper::GetDataType<T>())                              \
    {                                                                                              \
        auto blocksInfoT = AllStepsBlocksInfo(                                                     \
            Variable<T>(reinterpret_cast<core::Variable<T> *>(variable.m_Variable)));              \
        for (const auto &bv : blocksInfoT)                                                         \
        {                                                                                          \
            auto &bvr = ret[bv.first];                                                             \
            for (const auto &b : bv.second)                                                        \
            {                                                                                      \
                bvr.emplace_back();                                                                \
                auto &br = bvr.back();                                                             \
                br.Start = b.Start;                                                                \
                br.Count = b.Count;                                                                \
                br.WriterID = b.WriterID;                                                          \
                br.Step = b.Step;                                                                  \
                br.IsReverseDims = b.IsReverseDims;                                                \
                br.IsValue = b.IsValue;                                                            \
            }                                                                                      \
        }                                                                                          \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    else
    {
        helper::Throw<std::runtime_error>("bindings::CXX11", "Engine", "AllStepsBlocksInfo",
                                          "invalid data type");
    }